

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_set_standard_lookup.c
# Opt level: O2

uint hash(char *p)

{
  char cVar1;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    cVar1 = *p;
    if (cVar1 == '\0') break;
    p = p + 1;
    uVar2 = uVar2 * 0x10 + (int)cVar1;
    if ((uVar2 & 0xf0000000) != 0) {
      uVar2 = uVar2 & 0xfffffff ^ (uVar2 & 0xf0000000) >> 0x18;
    }
  }
  return uVar2;
}

Assistant:

static unsigned int
hash(const char *p)
{
	/* A 32-bit version of Peter Weinberger's (PJW) hash algorithm,
	   as used by ELF for hashing function names. */
	unsigned g, h = 0;
	while (*p != '\0') {
		h = (h << 4) + *p++;
		if ((g = h & 0xF0000000) != 0) {
			h ^= g >> 24;
			h &= 0x0FFFFFFF;
		}
	}
	return h;
}